

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O0

void __thiscall
GdlSetAttrItem::MergeColRangeAndPriority
          (GdlSetAttrItem *this,GrcManager *pcman,GrcFont *pfont,int ipavsFlags,int ipavsRange,
          int ipavsPriority)

{
  int iVar1;
  int iVar2;
  Symbol pGVar3;
  reference ppGVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int in_ECX;
  undefined8 in_RDX;
  GrcManager *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  GdlAttrValueSpec *pavsFlagsNew;
  bool fCanSub;
  SymbolSet setpsymBogus;
  GdlExpression *pexpFlags;
  GdlExpression *pexpFlagsTemp;
  Symbol psymPlus;
  GdlExpression *pexpPriority;
  GdlExpression *pexpRange;
  GdlExpression *pexpFlagsOld;
  Symbol psymEquals;
  Symbol psymCollisionFlags;
  GdlExpression *in_stack_fffffffffffffe08;
  GdlSetAttrItem *pexpValue;
  GdlExpression *in_stack_fffffffffffffe10;
  GdlSetAttrItem *in_stack_fffffffffffffe18;
  GdlSetAttrItem *in_stack_fffffffffffffe20;
  GdlSetAttrItem *in_stack_fffffffffffffe28;
  GdlSetAttrItem *in_stack_fffffffffffffe30;
  GrcStructName *in_stack_fffffffffffffe50;
  GrcSymbolTable *in_stack_fffffffffffffe58;
  undefined1 local_161;
  undefined1 local_160 [48];
  GdlSetAttrItem *local_130;
  GdlSetAttrItem *local_128;
  allocator local_119;
  string local_118 [32];
  Symbol local_f8;
  GdlSetAttrItem *local_f0;
  GdlSetAttrItem *local_e8;
  long local_e0;
  allocator local_d1;
  string local_d0 [32];
  Symbol local_b0;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [56];
  Symbol local_30;
  int local_24;
  int local_20;
  int local_1c;
  undefined8 local_18;
  GrcManager *local_10;
  
  if ((in_R8D != -1) || (in_R9D != -1)) {
    local_24 = in_R9D;
    local_20 = in_R8D;
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    GrcManager::SymbolTable(in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"collision",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"flags",&local_a1);
    GrcStructName::GrcStructName
              ((GrcStructName *)in_stack_fffffffffffffe20,(string *)in_stack_fffffffffffffe18,
               (string *)in_stack_fffffffffffffe10);
    pGVar3 = GrcSymbolTable::FindSymbol(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    GrcStructName::~GrcStructName((GrcStructName *)0x16b595);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    local_30 = pGVar3;
    GrcManager::SymbolTable(local_10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"=",&local_d1);
    pGVar3 = GrcSymbolTable::FindSymbol
                       ((GrcSymbolTable *)in_stack_fffffffffffffe30,
                        (string *)in_stack_fffffffffffffe28);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    local_e0 = 0;
    local_e8 = (GdlSetAttrItem *)0x0;
    local_f0 = (GdlSetAttrItem *)0x0;
    local_b0 = pGVar3;
    if (-1 < local_1c) {
      ppGVar4 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
                          ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                           (in_RDI + 0x78),(long)local_1c);
      iVar1 = (**(*ppGVar4)->m_pexpValue->_vptr_GdlExpression)();
      local_e0 = CONCAT44(extraout_var,iVar1);
    }
    if (-1 < local_20) {
      ppGVar4 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
                          ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                           (in_RDI + 0x78),(long)local_20);
      iVar1 = (**(*ppGVar4)->m_pexpValue->_vptr_GdlExpression)();
      local_e8 = (GdlSetAttrItem *)CONCAT44(extraout_var_00,iVar1);
    }
    if (-1 < local_24) {
      ppGVar4 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
                          ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                           (in_RDI + 0x78),(long)local_24);
      iVar1 = (**(*ppGVar4)->m_pexpValue->_vptr_GdlExpression)();
      local_f0 = (GdlSetAttrItem *)CONCAT44(extraout_var_01,iVar1);
    }
    GrcManager::SymbolTable(local_10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"+",&local_119);
    pGVar3 = GrcSymbolTable::FindSymbol
                       ((GrcSymbolTable *)in_stack_fffffffffffffe30,
                        (string *)in_stack_fffffffffffffe28);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    local_128 = (GdlSetAttrItem *)0x0;
    local_f8 = pGVar3;
    std::set<GrcSymbolTableEntry_*,_SymbolLess,_std::allocator<GrcSymbolTableEntry_*>_>::set
              ((set<GrcSymbolTableEntry_*,_SymbolLess,_std::allocator<GrcSymbolTableEntry_*>_> *)
               0x16b8a7);
    iVar1 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    if ((local_e8 == (GdlSetAttrItem *)0x0) || (local_f0 == (GdlSetAttrItem *)0x0)) {
      if ((local_e8 == (GdlSetAttrItem *)0x0) || (local_e0 == 0)) {
        if ((local_f0 == (GdlSetAttrItem *)0x0) || (local_e0 == 0)) {
          if (local_e8 == (GdlSetAttrItem *)0x0) {
            if (local_f0 != (GdlSetAttrItem *)0x0) {
              local_128 = local_f0;
            }
          }
          else {
            local_128 = local_e8;
          }
        }
        else {
          in_stack_fffffffffffffe18 = (GdlSetAttrItem *)operator_new(0x50);
          GdlBinaryExpression::GdlBinaryExpression
                    ((GdlBinaryExpression *)in_stack_fffffffffffffe20,
                     (Symbol)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                     in_stack_fffffffffffffe08);
          local_128 = in_stack_fffffffffffffe18;
        }
      }
      else {
        in_stack_fffffffffffffe20 = (GdlSetAttrItem *)operator_new(0x50);
        GdlBinaryExpression::GdlBinaryExpression
                  ((GdlBinaryExpression *)in_stack_fffffffffffffe20,
                   (Symbol)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                   in_stack_fffffffffffffe08);
        local_128 = in_stack_fffffffffffffe20;
      }
    }
    else {
      in_stack_fffffffffffffe30 = (GdlSetAttrItem *)operator_new(0x50);
      GdlBinaryExpression::GdlBinaryExpression
                ((GdlBinaryExpression *)in_stack_fffffffffffffe20,(Symbol)in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      local_128 = in_stack_fffffffffffffe30;
      if (local_e0 != 0) {
        in_stack_fffffffffffffe28 = (GdlSetAttrItem *)operator_new(0x50);
        GdlBinaryExpression::GdlBinaryExpression
                  ((GdlBinaryExpression *)in_stack_fffffffffffffe20,
                   (Symbol)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                   in_stack_fffffffffffffe08);
        local_128 = in_stack_fffffffffffffe28;
      }
      iVar1 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    }
    pexpValue = local_128;
    pGVar3 = (Symbol)GrcManager::GlyphAttrMatrix(local_10);
    iVar2 = (*(pexpValue->super_GdlRuleItem)._vptr_GdlRuleItem[0xf])
                      (pexpValue,pGVar3,0xffff,local_160,local_18,0,&local_161);
    local_130 = (GdlSetAttrItem *)CONCAT44(extraout_var_02,iVar2);
    if ((local_128 != local_130) && (local_128 != (GdlSetAttrItem *)0x0)) {
      (*(local_128->super_GdlRuleItem)._vptr_GdlRuleItem[2])();
    }
    operator_new(0x48);
    GdlAttrValueSpec::GdlAttrValueSpec
              ((GdlAttrValueSpec *)in_stack_fffffffffffffe20,(Symbol)in_stack_fffffffffffffe18,
               pGVar3,(GdlExpression *)pexpValue);
    iVar2 = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
    if (local_1c < 0) {
      if (local_20 < 0) {
        ReplaceAttrSetting(in_stack_fffffffffffffe20,iVar2,(GdlAttrValueSpec *)pGVar3);
      }
      else {
        ReplaceAttrSetting(in_stack_fffffffffffffe20,iVar2,(GdlAttrValueSpec *)pGVar3);
        if (-1 < local_24) {
          EraseAttrSetting(in_stack_fffffffffffffe30,iVar1);
        }
      }
    }
    else {
      ReplaceAttrSetting(in_stack_fffffffffffffe20,iVar2,(GdlAttrValueSpec *)pGVar3);
      if (-1 < local_20) {
        EraseAttrSetting(in_stack_fffffffffffffe30,iVar1);
      }
      if (-1 < local_24) {
        EraseAttrSetting(in_stack_fffffffffffffe30,iVar1);
      }
    }
    std::set<GrcSymbolTableEntry_*,_SymbolLess,_std::allocator<GrcSymbolTableEntry_*>_>::~set
              ((set<GrcSymbolTableEntry_*,_SymbolLess,_std::allocator<GrcSymbolTableEntry_*>_> *)
               0x16bd52);
  }
  return;
}

Assistant:

void GdlSetAttrItem::MergeColRangeAndPriority(GrcManager * pcman, GrcFont * pfont,
	int ipavsFlags, int ipavsRange, int ipavsPriority)
{
	if (ipavsRange == -1 && ipavsPriority == -1)
		return;

	Symbol psymCollisionFlags = pcman->SymbolTable()->FindSymbol(GrcStructName("collision", "flags"));
	Symbol psymEquals = pcman->SymbolTable()->FindSymbol("=");

	GdlExpression * pexpFlagsOld = nullptr;
	GdlExpression * pexpRange = nullptr;
	GdlExpression * pexpPriority = nullptr;
	if (ipavsFlags >= 0)
		pexpFlagsOld = m_vpavs[ipavsFlags]->m_pexpValue->Clone();
	if (ipavsRange >= 0)
		pexpRange = m_vpavs[ipavsRange]->m_pexpValue->Clone();
	if (ipavsPriority >= 0)
		pexpPriority = m_vpavs[ipavsPriority]->m_pexpValue->Clone();

	Symbol psymPlus = pcman->SymbolTable()->FindSymbol("+");
	GdlExpression * pexpFlagsTemp = nullptr;
	GdlExpression * pexpFlags;
	SymbolSet setpsymBogus;
	bool fCanSub;
	if (pexpRange && pexpPriority)
	{
		pexpFlagsTemp = new GdlBinaryExpression(psymPlus, pexpRange, pexpPriority);
		if (pexpFlagsOld)
			pexpFlagsTemp = new GdlBinaryExpression(psymPlus, pexpFlagsOld, pexpFlagsTemp);
	}
	else if (pexpRange && pexpFlagsOld)
		pexpFlagsTemp = new GdlBinaryExpression(psymPlus, pexpRange, pexpFlagsOld);
	else if (pexpPriority && pexpFlagsOld)
		pexpFlagsTemp = new GdlBinaryExpression(psymPlus, pexpPriority, pexpFlagsOld);
	else if (pexpRange)
		pexpFlagsTemp = pexpRange;
	else if (pexpPriority)
		pexpFlagsTemp = pexpPriority;

	assert(pexpFlagsTemp);
	pexpFlags = pexpFlagsTemp->SimplifyAndUnscale(pcman->GlyphAttrMatrix(), -1, setpsymBogus, pfont, false, &fCanSub);
	if (pexpFlagsTemp != pexpFlags)
		delete pexpFlagsTemp;

	GdlAttrValueSpec * pavsFlagsNew = new GdlAttrValueSpec(psymCollisionFlags, psymEquals, pexpFlags);

	if (ipavsFlags >= 0)
	{
		ReplaceAttrSetting(ipavsFlags, pavsFlagsNew);
		if (ipavsRange >= 0)
			EraseAttrSetting(ipavsRange);
		if (ipavsPriority >= 0)
			EraseAttrSetting(ipavsPriority);
	}
	else if (ipavsRange >= 0)
	{
		ReplaceAttrSetting(ipavsRange, pavsFlagsNew);
		if (ipavsPriority >= 0)
			EraseAttrSetting(ipavsPriority);
	}
	else
	{
		ReplaceAttrSetting(ipavsPriority, pavsFlagsNew);
	}
}